

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O0

void __thiscall rtc::GlobalLockPod::Unlock(GlobalLockPod *this)

{
  ostream *poVar1;
  FatalMessage local_198;
  string *local_20;
  string *_result;
  GlobalLockPod *pGStack_10;
  int old_value;
  GlobalLockPod *this_local;
  
  pGStack_10 = this;
  _result._4_4_ = AtomicOps::CompareAndSwap(&this->lock_acquired,1,0);
  local_20 = CheckEQImpl_abi_cxx11_(1,_result._4_4_,"1 == old_value");
  if (local_20 != (string *)0x0) {
    FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
               ,0xe8,local_20);
    poVar1 = FatalMessage::stream(&local_198);
    std::operator<<(poVar1,"Unlock called without calling Lock first");
    FatalMessage::~FatalMessage(&local_198);
  }
  return;
}

Assistant:

void GlobalLockPod::Unlock() {
  int old_value = AtomicOps::CompareAndSwap(&lock_acquired, 1, 0);
  RTC_DCHECK_EQ(1, old_value) << "Unlock called without calling Lock first";
}